

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O0

bool doubles_equal(double d1,double d2,double threshold)

{
  int iVar1;
  double in_XMM0_Qa;
  double dVar2;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  double in_XMM2_Qa;
  
  dVar2 = (double)CONCAT44(in_XMM1_Db,in_XMM1_Da);
  iVar1 = (*PlatformSpecificIsNan)(in_XMM0_Qa);
  if (((iVar1 == 0) && (iVar1 = (*PlatformSpecificIsNan)(dVar2), iVar1 == 0)) &&
     (iVar1 = (*PlatformSpecificIsNan)(in_XMM2_Qa), iVar1 == 0)) {
    iVar1 = (*PlatformSpecificIsInf)(in_XMM0_Qa);
    if ((iVar1 != 0) && (iVar1 = (*PlatformSpecificIsInf)(dVar2), iVar1 != 0)) {
      return true;
    }
    dVar2 = (*PlatformSpecificFabs)(in_XMM0_Qa - dVar2);
    return dVar2 <= in_XMM2_Qa;
  }
  return false;
}

Assistant:

bool doubles_equal(double d1, double d2, double threshold)
{
    if (PlatformSpecificIsNan(d1) || PlatformSpecificIsNan(d2) || PlatformSpecificIsNan(threshold))
        return false;

    if (PlatformSpecificIsInf(d1) && PlatformSpecificIsInf(d2))
    {
        return true;
    }

    return PlatformSpecificFabs(d1 - d2) <= threshold;
}